

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O1

void __thiscall mognetwork::TcpSocket::~TcpSocket(TcpSocket *this)

{
  pointer pcVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__TcpSocket_00113c98;
  if (this->m_protocolListener != (AProtocolListener *)0x0) {
    (*this->m_protocolListener->_vptr_AProtocolListener[1])();
  }
  Mutex::~Mutex(&this->m_mutex);
  pcVar1 = (this->m_pendingRDatas).datas.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  p_Var3 = (this->m_pendingDatas).
           super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->m_pendingDatas) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  Socket::~Socket(&this->super_Socket);
  return;
}

Assistant:

TcpSocket::~TcpSocket()
  {
    if (m_protocolListener != NULL)
      delete m_protocolListener;
  }